

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void build_colors(chunk_conflict *c,int *colors,int *counts,_Bool *stairs,_Bool diagonal)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  loc lVar4;
  wchar_t local_40;
  wchar_t color;
  wchar_t w;
  wchar_t h;
  wchar_t x;
  wchar_t y;
  _Bool diagonal_local;
  _Bool *stairs_local;
  int *counts_local;
  int *colors_local;
  chunk_conflict *c_local;
  
  wVar1 = c->height;
  wVar2 = c->width;
  local_40 = L'\x01';
  for (h = L'\0'; h < wVar1; h = h + L'\x01') {
    for (w = L'\0'; w < wVar2; w = w + L'\x01') {
      lVar4 = loc(w,h);
      wVar3 = ignore_point(c,colors,lVar4);
      if (wVar3 == L'\0') {
        lVar4 = loc(w,h);
        build_color_point(c,colors,counts,stairs,lVar4,local_40,diagonal);
        local_40 = local_40 + L'\x01';
      }
    }
  }
  return;
}

Assistant:

static void build_colors(struct chunk *c, int colors[], int counts[],
		bool *stairs, bool diagonal)
{
	int y, x;
	int h = c->height;
	int w = c->width;
	int color = 1;

	for (y = 0; y < h; y++) {
		for (x = 0; x < w; x++) {
			if (ignore_point(c, colors, loc(x, y))) continue;
			build_color_point(c, colors, counts, stairs,
				loc(x, y), color, diagonal);
			color++;
		}
	}
}